

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot.h
# Opt level: O2

Plot * plotLines<Result<unsigned_int,double>>
                 (Plot *__return_storage_ptr__,
                 vector<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
                 *rs,function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
                     *valuesFunc,storage_t sizePercent,string *title,string *yLabel)

{
  pointer pRVar1;
  vector<double,_std::allocator<double>_> *y;
  DrawSpecs *pDVar2;
  pointer pRVar3;
  ulong uVar4;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  storage_range_t sVar5;
  allocator<char> local_101;
  double local_100;
  undefined1 local_f8 [16];
  function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
  *local_e8;
  valarray<double> x;
  string local_d0;
  string local_b0;
  string local_90;
  function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
  local_70;
  string local_50;
  
  local_e8 = valuesFunc;
  std::
  function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
  ::function(&local_70,valuesFunc);
  sVar5 = calculateMedianRange<Result<unsigned_int,double>>(rs,&local_70,sizePercent);
  local_100 = sVar5.first;
  local_f8._8_4_ = in_XMM1_Dc;
  local_f8._0_8_ = sVar5.second;
  local_f8._12_4_ = in_XMM1_Dd;
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  pRVar3 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sciplot::linspace<unsigned_int,unsigned_int,double>
            ((sciplot *)&x,(pRVar3->inputRange).first,(pRVar3->inputRange).second,
             pRVar3->samplesInRange);
  sciplot::Plot::Plot(__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_101);
  sciplot::Plot::xlabel(__return_storage_ptr__,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,(string *)title);
  sciplot::TitleSpecsOf<sciplot::LegendSpecs>::title
            (&(__return_storage_ptr__->m_legend).super_TitleSpecsOf<sciplot::LegendSpecs>,&local_b0)
  ;
  std::__cxx11::string::~string((string *)&local_b0);
  sciplot::LineSpecsOf<sciplot::BorderSpecs>::lineWidth
            (&(__return_storage_ptr__->m_border).super_LineSpecsOf<sciplot::BorderSpecs>,1);
  std::__cxx11::string::string((string *)&local_d0,(string *)yLabel);
  sciplot::Plot::ylabel(__return_storage_ptr__,&local_d0);
  uVar4 = -(ulong)((double)local_f8._0_8_ - local_100 == 0.0);
  local_f8._0_8_ = ~uVar4 & local_f8._0_8_ | (ulong)(local_100 + 1.0) & uVar4;
  std::__cxx11::string::~string((string *)&local_d0);
  sciplot::Plot::yrange(__return_storage_ptr__,local_100,(double)local_f8._0_8_);
  pRVar1 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar3 = (rs->
                super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    y = std::
        function<const_std::vector<double,_std::allocator<double>_>_&(const_Result<unsigned_int,_double>_&)>
        ::operator()(local_e8,pRVar3);
    pDVar2 = sciplot::Plot::
             drawCurve<std::valarray<double>,std::vector<double,std::allocator<double>>>
                       (__return_storage_ptr__,&x,y);
    std::__cxx11::string::string((string *)&local_50,(string *)&pRVar3->description);
    pDVar2 = sciplot::DrawSpecs::label(pDVar2,&local_50);
    sciplot::LineSpecsOf<sciplot::DrawSpecs>::lineWidth
              (&pDVar2->super_LineSpecsOf<sciplot::DrawSpecs>,1);
    std::__cxx11::string::~string((string *)&local_50);
  }
  operator_delete(x._M_data);
  return __return_storage_ptr__;
}

Assistant:

sciplot::Plot plotLines(const std::vector<ResultT>& rs, std::function<const std::vector<typename ResultT::storage_t>&(const ResultT&)> valuesFunc, typename ResultT::storage_t sizePercent, const std::string& title, const std::string& yLabel)
{
    auto rangePercent = calculateMedianRange(rs, valuesFunc, sizePercent);
    rangePercent.second = rangePercent.second - rangePercent.first == 0 ? rangePercent.first + 1 : rangePercent.second;
    const auto& fr = rs.front();
    const auto x = sciplot::linspace(fr.inputRange.first, fr.inputRange.second, fr.samplesInRange);
    sciplot::Plot p;
    p.tics();
    p.xlabel("");
    p.legend().title(title);
    p.border().lineWidth(1);
    p.ylabel(yLabel);
    p.yrange(rangePercent.first, rangePercent.second);
    for (const auto& r : rs)
    {
        p.drawCurve(x, valuesFunc(r)).label(r.description).lineWidth(1);
    }
    return p;
}